

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# 02-basic.cpp
# Opt level: O0

void bar(Slacking *slack)

{
  CategoryChat *text;
  exception *e;
  string local_f0 [39];
  allocator local_c9;
  string local_c8 [32];
  undefined1 local_a8 [24];
  string local_90 [39];
  allocator local_69;
  string local_68 [55];
  allocator local_31;
  string local_30 [32];
  Slacking *local_10;
  Slacking *slack_local;
  
  local_10 = slack;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"#mychannel",&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_68,"botname",&local_69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,":bird:",(allocator *)(local_a8 + 0x17));
  ::slack::_detail::CategoryChat::channel_username_iconemoji
            (&slack->chat,(string *)local_30,(string *)local_68,(string *)local_90);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)(local_a8 + 0x17));
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator((allocator<char> *)&local_69);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  text = &local_10->chat;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c8,"bar() function is called",&local_c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f0,"",(allocator *)((long)&e + 7));
  ::slack::_detail::CategoryChat::postMessage
            ((CategoryChat *)local_a8,&text->channel,(string *)local_c8);
  nlohmann::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                 *)local_a8);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&e + 7));
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  return;
}

Assistant:

void bar(slack::Slacking& slack) {
    // You can try catch API method if an error occur
    try {
        slack.chat.channel_username_iconemoji("#mychannel", "botname", ":bird:"); // for lazy people
        slack.chat.postMessage("bar() function is called");
    }
    catch(std::exception const& e) {
        std::cerr << e.what() << '\n';
    }
}